

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animstate.cpp
# Opt level: O0

void AnimSeqEval(CAnimSequence *pSeq,float Time,CAnimKeyframe *pFrame)

{
  undefined8 *puVar1;
  float *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  int i;
  float Blend;
  CAnimKeyframe *pFrame2;
  CAnimKeyframe *pFrame1;
  int local_30;
  float local_2c;
  float *local_28;
  float *local_20;
  
  if (*in_RDI == 0) {
    *in_RSI = 0.0;
    in_RSI[1] = 0.0;
    in_RSI[2] = 0.0;
    in_RSI[3] = 0.0;
  }
  else if (*in_RDI == 1) {
    puVar1 = *(undefined8 **)(in_RDI + 2);
    *(undefined8 *)in_RSI = *puVar1;
    *(undefined8 *)(in_RSI + 2) = puVar1[1];
  }
  else {
    local_20 = (float *)0x0;
    local_28 = (float *)0x0;
    local_2c = 0.0;
    for (local_30 = 1; local_30 < *in_RDI; local_30 = local_30 + 1) {
      if ((*(float *)(*(long *)(in_RDI + 2) + (long)(local_30 + -1) * 0x10) <= in_XMM0_Da) &&
         (in_XMM0_Da <= *(float *)(*(long *)(in_RDI + 2) + (long)local_30 * 0x10))) {
        local_20 = (float *)(*(long *)(in_RDI + 2) + (long)(local_30 + -1) * 0x10);
        local_28 = (float *)(*(long *)(in_RDI + 2) + (long)local_30 * 0x10);
        local_2c = (in_XMM0_Da - *local_20) / (*local_28 - *local_20);
        break;
      }
    }
    if ((local_20 != (float *)0x0) && (local_28 != (float *)0x0)) {
      *in_RSI = in_XMM0_Da;
      fVar2 = mix<float,float>(local_20[1],local_28[1],local_2c);
      in_RSI[1] = fVar2;
      fVar2 = mix<float,float>(local_20[2],local_28[2],local_2c);
      in_RSI[2] = fVar2;
      fVar2 = mix<float,float>(local_20[3],local_28[3],local_2c);
      in_RSI[3] = fVar2;
    }
  }
  return;
}

Assistant:

static void AnimSeqEval(CAnimSequence *pSeq, float Time, CAnimKeyframe *pFrame)
{
	if(pSeq->m_NumFrames == 0)
	{
		pFrame->m_Time = 0;
		pFrame->m_X = 0;
		pFrame->m_Y = 0;
		pFrame->m_Angle = 0;
	}
	else if(pSeq->m_NumFrames == 1)
	{
		*pFrame = pSeq->m_aFrames[0];
	}
	else
	{
		//time = maximum(0.0f, minimum(1.0f, time / duration)); // TODO: use clamp
		CAnimKeyframe *pFrame1 = 0;
		CAnimKeyframe *pFrame2 = 0;
		float Blend = 0.0f;

		// TODO: make this smarter.. binary search
		for (int i = 1; i < pSeq->m_NumFrames; i++)
		{
			if (pSeq->m_aFrames[i-1].m_Time <= Time && pSeq->m_aFrames[i].m_Time >= Time)
			{
				pFrame1 = &pSeq->m_aFrames[i-1];
				pFrame2 = &pSeq->m_aFrames[i];
				Blend = (Time - pFrame1->m_Time) / (pFrame2->m_Time - pFrame1->m_Time);
				break;
			}
		}

		if (pFrame1 && pFrame2)
		{
			pFrame->m_Time = Time;
			pFrame->m_X = mix(pFrame1->m_X, pFrame2->m_X, Blend);
			pFrame->m_Y = mix(pFrame1->m_Y, pFrame2->m_Y, Blend);
			pFrame->m_Angle = mix(pFrame1->m_Angle, pFrame2->m_Angle, Blend);
		}
	}
}